

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::Copy(aiNode **_dest,aiNode *src)

{
  aiNode *this;
  uint local_30;
  uint i;
  aiNode *dest;
  aiNode *src_local;
  aiNode **_dest_local;
  
  this = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this);
  *_dest = this;
  memcpy(this,src,0x478);
  if (src->mMetaData != (aiMetadata *)0x0) {
    Copy(&this->mMetaData,src->mMetaData);
  }
  GetArrayCopy<unsigned_int>(&this->mMeshes,this->mNumMeshes);
  CopyPtrArray<aiNode>(&this->mChildren,src->mChildren,this->mNumChildren);
  for (local_30 = 0; local_30 < this->mNumChildren; local_30 = local_30 + 1) {
    this->mChildren[local_30]->mParent = this;
  }
  return;
}

Assistant:

void SceneCombiner::Copy     (aiNode** _dest, const aiNode* src)
{
    ai_assert(NULL != _dest && NULL != src);

    aiNode* dest = *_dest = new aiNode();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiNode));

    if (src->mMetaData) {
        Copy(&dest->mMetaData, src->mMetaData);
    }

    // and reallocate all arrays
    GetArrayCopy( dest->mMeshes, dest->mNumMeshes );
    CopyPtrArray( dest->mChildren, src->mChildren,dest->mNumChildren);

	// need to set the mParent fields to the created aiNode.
	for( unsigned int i = 0; i < dest->mNumChildren; i ++ ) {
		dest->mChildren[i]->mParent = dest;
	}
}